

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode Array_encodeBinary(void *src,size_t length,UA_DataType *type)

{
  code *pcVar1;
  UA_Byte *pUVar2;
  int iVar3;
  UA_StatusCode UVar4;
  ulong uVar5;
  size_t finished;
  long lVar6;
  size_t i;
  ulong uVar7;
  size_t sVar8;
  
  UVar4 = 0x80020000;
  if ((length < 0x80000000) && (UVar4 = 0x80080000, pos + 4 <= end)) {
    iVar3 = -(uint)(src != (void *)0x1);
    if (length != 0) {
      iVar3 = (int)length;
    }
    *(int *)pos = iVar3;
    pos = pos + 4;
    if (length != 0) {
      if ((type->field_0x25 & 4) == 0) {
        if ((type->field_0x25 & 1) == 0) {
          uVar7 = 0x19;
        }
        else {
          uVar7 = (ulong)type->typeIndex;
        }
        pcVar1 = (code *)(&encodeBinaryJumpTable)[uVar7];
        for (uVar7 = 0; pUVar2 = pos, uVar7 < length; uVar7 = uVar7 + 1) {
          UVar4 = (*pcVar1)(src,type);
          src = (void *)((ulong)type->memSize + (long)src);
          if (UVar4 != 0) {
            if (UVar4 == 0x80080000) {
              pos = pUVar2;
              UVar4 = exchangeBuffer();
              src = (void *)((long)src - (ulong)type->memSize);
              uVar7 = uVar7 - 1;
            }
            if (UVar4 != 0) {
              return UVar4;
            }
          }
        }
      }
      else {
        uVar7 = (ulong)type->memSize;
        lVar6 = 0;
        while (sVar8 = (length - lVar6) * uVar7, end < pos + sVar8) {
          uVar5 = (ulong)((long)end - (long)pos) / uVar7;
          sVar8 = uVar5 * uVar7;
          memcpy(pos,src,sVar8);
          pos = pos + sVar8;
          src = (void *)((long)src + sVar8);
          lVar6 = lVar6 + uVar5;
          UVar4 = exchangeBuffer();
          if (UVar4 != 0) {
            return UVar4;
          }
        }
        memcpy(pos,src,sVar8);
        pos = pos + sVar8;
      }
    }
    UVar4 = 0;
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
Array_encodeBinary(const void *src, size_t length, const UA_DataType *type) {
    /* Check and convert the array length to int32 */
    UA_Int32 signed_length = -1;
    if(length > UA_INT32_MAX)
        return UA_STATUSCODE_BADINTERNALERROR;
    if(length > 0)
        signed_length = (UA_Int32)length;
    else if(src == UA_EMPTY_ARRAY_SENTINEL)
        signed_length = 0;

    /* Encode the array length */
    UA_StatusCode retval = Int32_encodeBinary(&signed_length);
    if(retval != UA_STATUSCODE_GOOD || length == 0)
        return retval;

    /* Encode the content */
    if(!type->overlayable)
        return Array_encodeBinaryComplex((uintptr_t)src, length, type);
    return Array_encodeBinaryOverlayable((uintptr_t)src, length, type->memSize);
}